

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall
format::mtx_arith_error::mtx_arith_error
          (mtx_arith_error *this,string *expected_arith,string *got_arith,string *filename,
          string *msg)

{
  string sStack_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)filename);
  std::__cxx11::string::string((string *)&sStack_68,(string *)msg);
  mtx_error::mtx_error(&this->super_mtx_error,&local_48,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&this->super_mtx_error = &PTR__mtx_arith_error_0016c720;
  (this->expected_arith_)._M_dataplus._M_p = (pointer)&(this->expected_arith_).field_2;
  (this->expected_arith_)._M_string_length = 0;
  (this->expected_arith_).field_2._M_local_buf[0] = '\0';
  (this->got_arith_)._M_dataplus._M_p = (pointer)&(this->got_arith_).field_2;
  (this->got_arith_)._M_string_length = 0;
  (this->got_arith_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->expected_arith_);
  std::__cxx11::string::_M_assign((string *)&this->got_arith_);
  return;
}

Assistant:

mtx_arith_error
  (
    std::string expected_arith,
    std::string got_arith,
    std::string filename="Unknown",
    std::string msg="Matrix arithmetic mismatch"
  )
  : mtx_error(filename, msg)
  {
   expected_arith_ = expected_arith;
   got_arith_ = got_arith;
  }